

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::commandCannotBuildOutputDueToMissingInputs
          (BuildSystemFrontendDelegate *this,Command *command,Node *output,
          ArrayRef<llbuild::buildsystem::BuildKey> inputs)

{
  bool bVar1;
  raw_ostream *prVar2;
  BuildKey *this_00;
  string *this_01;
  size_t i;
  ulong Index;
  ulong uVar3;
  StringRef local_c0;
  ArrayRef<llbuild::buildsystem::BuildKey> inputs_local;
  string local_a0;
  string message;
  raw_string_ostream messageStream;
  
  inputs_local.Data = inputs.Data;
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  messageStream.super_raw_ostream.BufferMode = InternalBuffer;
  messageStream.super_raw_ostream.OutBufStart = (char *)0x0;
  messageStream.super_raw_ostream.OutBufEnd = (char *)0x0;
  messageStream.super_raw_ostream.OutBufCur = (char *)0x0;
  messageStream.super_raw_ostream._vptr_raw_ostream =
       (_func_int **)&PTR__raw_string_ostream_0023ea78;
  messageStream.OS = &message;
  inputs_local.Length = inputs.Length;
  llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,"cannot build \'");
  local_c0.Data = (output->name)._M_dataplus._M_p;
  local_c0.Length = (output->name)._M_string_length;
  llvm::StringRef::str_abi_cxx11_(&local_a0,&local_c0);
  llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,&local_a0);
  std::__cxx11::string::_M_dispose();
  llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,"\' due to missing inputs: ");
  uVar3 = inputs.Length;
  for (Index = 0; Index < uVar3; Index = Index + 1) {
    if (Index != 0) {
      llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,", ");
    }
    prVar2 = llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,"\'");
    this_00 = llvm::ArrayRef<llbuild::buildsystem::BuildKey>::operator[](&inputs_local,Index);
    bVar1 = BuildKey::isNode(this_00);
    this_01 = (string *)
              llvm::ArrayRef<llbuild::buildsystem::BuildKey>::operator[](&inputs_local,Index);
    if (bVar1) {
      local_c0 = BuildKey::getNodeName((BuildKey *)this_01);
      llvm::StringRef::str_abi_cxx11_(&local_a0,&local_c0);
    }
    else {
      std::__cxx11::string::string((string *)&local_a0,this_01);
    }
    prVar2 = llvm::raw_ostream::operator<<(prVar2,&local_a0);
    llvm::raw_ostream::operator<<(prVar2,"\'");
    std::__cxx11::string::_M_dispose();
    uVar3 = inputs_local.Length;
  }
  llvm::raw_ostream::flush(&messageStream.super_raw_ostream);
  fwrite(message._M_dataplus._M_p,message._M_string_length,1,_stderr);
  fflush(_stderr);
  llvm::raw_string_ostream::~raw_string_ostream(&messageStream);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void BuildSystemFrontendDelegate::commandCannotBuildOutputDueToMissingInputs(
     Command * command, Node *output, ArrayRef<BuildKey> inputs) {
  std::string message;
  llvm::raw_string_ostream messageStream(message);

  messageStream << "cannot build '";
  messageStream << output->getName().str();
  messageStream << "' due to missing inputs: ";

  for (size_t i = 0; i < inputs.size(); ++i) {
    if (i > 0) {
      messageStream << ", ";
    }
    messageStream << "'" << (inputs[i].isNode() ? inputs[i].getNodeName().str() : inputs[i].getKeyData().str()) << "'";
  }

  messageStream.flush();
  fwrite(message.data(), message.size(), 1, stderr);
  fflush(stderr);
}